

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool medit_gold(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  CHAR_DATA *in_RSI;
  char *in_RDI;
  int index;
  MOB_INDEX_DATA *pMob;
  flag_type *flag_table;
  bool local_1;
  
  flag_table = *(flag_type **)(*(long *)(in_RDI + 0x80) + 0x6c60);
  if (*(char *)&in_RSI->next == '\0') {
    send_to_char(in_RDI,in_RSI);
    local_1 = false;
  }
  else {
    iVar1 = flag_lookup((char *)in_RSI,flag_table);
    if (iVar1 == -99) {
      medit_gold(in_RSI,(char *)flag_table);
      local_1 = false;
    }
    else {
      *(int *)&flag_table[0xc].name = iVar1;
      send_to_char(in_RDI,in_RSI);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool medit_gold(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	int index;

	EDIT_MOB(ch, pMob);

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:  wealth [none/poor/moderate/affluent/rich/peerless]\n\r", ch);
		return false;
	}

	index = flag_lookup(argument, wealth_table);

	if (index == NO_FLAG)
	{
		medit_gold(ch, "");
		return false;
	}

	pMob->wealth = index;
	send_to_char("Wealth set.\n\r", ch);
	return true;
}